

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::Thread(Thread *this,ThreadFunc *func,string *name)

{
  string *name_local;
  ThreadFunc *func_local;
  Thread *this_local;
  
  noncopyable::noncopyable((noncopyable *)this);
  this->started_ = false;
  this->joined_ = false;
  this->pthreadId_ = 0;
  this->tid_ = 0;
  std::function<void_()>::function(&this->func_,func);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  CountDownLatch::CountDownLatch(&this->latch_,1);
  setDefaultName(this);
  return;
}

Assistant:

Thread::Thread(const ThreadFunc& func, const std::string& name)
    : started_(false),
    joined_(false),
    pthreadId_(0),
    tid_(0),
    func_(func),
    name_(name),
    latch_(1) {
    setDefaultName();   
}